

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algebraic-sensor.cpp
# Opt level: O2

void __thiscall
stateObservation::AlgebraicSensor::setState(AlgebraicSensor *this,Vector *state,TimeIndex k)

{
  int iVar1;
  undefined4 extraout_var;
  Type TStack_58;
  
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<long>
            (&TStack_58,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)state,this->concat_);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&this->directInputToOutput_,
             &TStack_58.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
  iVar1 = (*(this->super_SensorBase)._vptr_SensorBase[0xe])(this);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<long>
            (&TStack_58,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)state,
             CONCAT44(extraout_var,iVar1));
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&this->state_,
             &TStack_58.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
  this->storedNoisyMeasurement_ = false;
  this->storedNoiselessMeasurement_ = false;
  this->time_ = k;
  return;
}

Assistant:

void AlgebraicSensor::setState(const Vector & state, TimeIndex k)
{
  directInputToOutput_ = state.tail(concat_);
  state_ = state.head(getStateSize_());
  storedNoisyMeasurement_ = false;
  storedNoiselessMeasurement_ = false;

  time_ = k;
}